

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pDepthTests.cpp
# Opt level: O2

ObjectData * __thiscall
deqp::gles3::Performance::anon_unknown_0::GradientCostCase::genOccluderGeometry
          (ObjectData *__return_storage_ptr__,GradientCostCase *this)

{
  float fVar1;
  _Vector_base<float,_std::allocator<float>_> local_f0;
  ProgramSources local_d8;
  
  fVar1 = this->m_gradientDistance;
  Utils::getBaseShader();
  Utils::getFullscreenQuadWithGradient
            ((vector<float,_std::allocator<float>_> *)&local_f0,0.0,1.0 - fVar1);
  ObjectData::ObjectData(__return_storage_ptr__,&local_d8,(Geometry *)&local_f0);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_f0);
  glu::ProgramSources::~ProgramSources(&local_d8);
  return __return_storage_ptr__;
}

Assistant:

virtual ObjectData	genOccluderGeometry	(void) const { return Utils::fastQuadWithGradient(0.0f, 1.0f - m_gradientDistance); }